

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool insn_crosses_page(CPUARMState_conflict *env,DisasContext_conflict1 *s)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint uVar4;
  
  iVar1 = s->sctlr_b;
  uVar3 = cpu_lduw_code_aarch64(env,(s->base).pc_next);
  uVar4 = (uint)(ushort)((ushort)uVar3 << 8 | (ushort)uVar3 >> 8);
  if (iVar1 == 0) {
    uVar4 = uVar3;
  }
  _Var2 = thumb_insn_is_16bit(s,(uint32_t)(s->base).pc_next,uVar4 & 0xffff);
  return !_Var2;
}

Assistant:

static bool insn_crosses_page(CPUARMState *env, DisasContext *s)
{
    /* Return true if the insn at dc->base.pc_next might cross a page boundary.
     * (False positives are OK, false negatives are not.)
     * We know this is a Thumb insn, and our caller ensures we are
     * only called if dc->base.pc_next is less than 4 bytes from the page
     * boundary, so we cross the page if the first 16 bits indicate
     * that this is a 32 bit insn.
     */
    uint16_t insn = arm_lduw_code(env, s->base.pc_next, s->sctlr_b);

    return !thumb_insn_is_16bit(s, s->base.pc_next, insn);
}